

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

void CALCT(int *BOOL,int NN,double *SR,double *SI,double *HR,double *HI,double *QHR,double *QHI,
          double ARE,double INFINY,double *PVR,double *PVI,double *TR,double *TI)

{
  bool bVar1;
  double dVar2;
  double local_70;
  double HVR;
  double HVI;
  double pvrt;
  double pvit;
  double local_48;
  double local_40;
  double local_38;
  
  pvit = (double)BOOL;
  local_40 = INFINY;
  local_38 = ARE;
  POLYEV(NN + -1,SR,SI,HR,HI,QHR,QHI,&local_70,&HVR);
  local_48 = CMOD(&local_70,&HVR);
  local_38 = local_38 * 10.0;
  dVar2 = CMOD(HR + (NN - 2U),HI + (NN - 2U));
  bVar1 = dVar2 * local_38 < local_48;
  *(uint *)pvit = (uint)!bVar1;
  HVI = -*PVR;
  pvrt = -*PVI;
  if (bVar1) {
    CDIVID(&HVI,&pvrt,&local_70,&HVR,local_40,TR,TI);
  }
  else {
    *TR = 0.0;
    *TI = 0.0;
  }
  return;
}

Assistant:

static void CALCT(int *BOOL, int NN, double *SR, double *SI, double *HR, double *HI,double *QHR, double *QHI,double ARE, double INFINY,double *PVR, double *PVI,double *TR, double *TI ) {
	/*
	C COMPUTES  T = -P(S)/H(S).
	C BOOL   - LOGICAL, SET TRUE IF H(S) IS ESSENTIALLY ZERO.
	*/
	double HVR, HVI, pvrt,pvit;
	int N;
	N = NN - 1;
	POLYEV(N, SR, SI, HR, HI, QHR, QHI, &HVR, &HVI);

	if (CMOD(&HVR, &HVI) <= ARE*10.0*CMOD(&HR[N - 1], &HI[N - 1])) {
		*BOOL = 1;
	}
	else {
		*BOOL = 0;
	}
	pvrt = -1.0 * *PVR;
	pvit = -1.0 * *PVI;
	if (*BOOL == 0) {
		CDIVID(&pvrt, &pvit, &HVR, &HVI, INFINY,TR, TI);
	}
	else {
		*TR = 0.0;
		*TI = 0.0;
	}

}